

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section8DifferentPoliciesTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  undefined1 local_d8 [8];
  PkitsTestInfo info;
  char *crls [3];
  char *pcStack_38;
  char *certs [4];
  Section8DifferentPoliciesTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
  *this_local;
  
  certs[1] = "GoodsubCACert";
  certs[2] = "DifferentPoliciesTest4EE";
  pcStack_38 = "TrustAnchorRootCertificate";
  certs[0] = "GoodCACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_d8);
  local_d8 = (undefined1  [8])0x6f50f6;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_d8,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)this
             ,(char *(*) [4])&pcStack_38,
             (char *(*) [3])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_d8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_d8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "GoodsubCACert", "DifferentPoliciesTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL",
                              "GoodsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.4";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}